

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O3

Point3f pbrt::weightBoundary(SDVertex *vert,Float beta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 auVar8 [16];
  float *pfVar9;
  SDFace *pSVar10;
  float *pfVar11;
  int iVar12;
  Point3f *pPVar13;
  size_t count;
  float fVar14;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Point3f PVar15;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
  pRing;
  polymorphic_allocator<pbrt::Point3<float>_> local_118;
  Tuple3<pbrt::Point3,_float> local_110;
  undefined1 local_100 [20];
  float local_ec;
  float local_e8 [50];
  
  pSVar10 = vert->startFace;
  if (vert->boundary == false) {
    iVar12 = 0;
    do {
      pSVar10 = SDFace::nextFace(pSVar10,vert);
      iVar12 = iVar12 + 1;
    } while (pSVar10 != vert->startFace);
  }
  else {
    iVar12 = 0;
    do {
      pSVar10 = SDFace::nextFace(pSVar10,vert);
      iVar12 = iVar12 + 1;
    } while (pSVar10 != (SDFace *)0x0);
    pSVar10 = vert->startFace;
    do {
      pSVar10 = SDFace::prevFace(pSVar10,vert);
      iVar12 = iVar12 + 1;
    } while (pSVar10 != (SDFace *)0x0);
  }
  count = (size_t)iVar12;
  local_118.memoryResource = pstd::pmr::new_delete_resource();
  local_110.z = 0.0;
  local_110.x = 0.0;
  local_110.y = 0.0;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                 *)local_100,count,(Point3<float> *)&local_110,&local_118);
  pPVar13 = (Point3f *)local_100._8_8_;
  if ((Point3f *)local_100._8_8_ == (Point3f *)0x0) {
    pPVar13 = (Point3f *)(local_100 + 0x10);
  }
  SDVertex::oneRing(vert,pPVar13);
  pfVar9 = &local_ec;
  auVar8._4_4_ = in_XMM0_Db;
  auVar8._0_4_ = beta;
  auVar8._8_4_ = in_XMM0_Dc;
  auVar8._12_4_ = in_XMM0_Dd;
  auVar8 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar8,ZEXT416(0x3f800000));
  fVar1 = (vert->p).super_Tuple3<pbrt::Point3,_float>.z;
  fVar14 = auVar8._0_4_;
  pPVar13 = (Point3f *)(local_100 + 0x10);
  if ((Point3f *)local_100._8_8_ != (Point3f *)0x0) {
    pPVar13 = (Point3f *)local_100._8_8_;
  }
  pfVar11 = local_e8;
  if ((Point3f *)local_100._8_8_ != (Point3f *)0x0) {
    pfVar11 = &((Tuple3<pbrt::Point3,_float> *)local_100._8_8_)->z;
    pfVar9 = &((Tuple3<pbrt::Point3,_float> *)local_100._8_8_)->y;
  }
  fVar2 = *pfVar11;
  fVar3 = pPVar13[count - 1].super_Tuple3<pbrt::Point3,_float>.z;
  uVar4 = (vert->p).super_Tuple3<pbrt::Point3,_float>.x;
  uVar6 = (vert->p).super_Tuple3<pbrt::Point3,_float>.y;
  auVar8 = vinsertps_avx(ZEXT416((uint)(pPVar13->super_Tuple3<pbrt::Point3,_float>).x),
                         ZEXT416((uint)*pfVar9),0x10);
  uVar5 = pPVar13[count - 1].super_Tuple3<pbrt::Point3,_float>.x;
  uVar7 = pPVar13[count - 1].super_Tuple3<pbrt::Point3,_float>.y;
  PVar15.super_Tuple3<pbrt::Point3,_float>.x =
       fVar14 * (float)uVar4 + auVar8._0_4_ * beta + (float)uVar5 * beta;
  PVar15.super_Tuple3<pbrt::Point3,_float>.y =
       fVar14 * (float)uVar6 + auVar8._4_4_ * beta + (float)uVar7 * beta;
  InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
  ~InlinedVector((InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
                  *)local_100);
  PVar15.super_Tuple3<pbrt::Point3,_float>.z = fVar14 * fVar1 + beta * fVar2 + beta * fVar3;
  return (Point3f)PVar15.super_Tuple3<pbrt::Point3,_float>;
}

Assistant:

static Point3f weightBoundary(SDVertex *vert, Float beta) {
    // Put _vert_ one-ring in _pRing_
    int valence = vert->valence();
    InlinedVector<Point3f, 16> pRing(valence);

    vert->oneRing(pRing.data());
    Point3f p = (1 - 2 * beta) * vert->p;
    p += beta * pRing[0];
    p += beta * pRing[valence - 1];
    return p;
}